

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O2

double generateGaussianNoise(double mu,double sigma)

{
  byte bVar1;
  int iVar2;
  long in_FS_OFFSET;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  bVar1 = *(byte *)(in_FS_OFFSET + -8);
  *(byte *)(in_FS_OFFSET + -8) = bVar1 ^ 1;
  if (bVar1 == 0) {
    do {
      iVar2 = rand();
      dVar3 = (double)iVar2 * 4.656612875245797e-10;
      iVar2 = rand();
    } while (dVar3 <= 2.2250738585072014e-308);
    dVar4 = log(dVar3);
    dVar4 = dVar4 * -2.0;
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
    dVar5 = (double)iVar2 * 4.656612875245797e-10 * 6.283185307179586;
    dVar6 = cos(dVar5);
    dVar3 = log(dVar3);
    dVar3 = dVar3 * -2.0;
    if (dVar3 < 0.0) {
      dVar3 = sqrt(dVar3);
    }
    else {
      dVar3 = SQRT(dVar3);
    }
    dVar4 = dVar4 * dVar6;
    dVar5 = sin(dVar5);
    *(double *)(in_FS_OFFSET + -0x10) = dVar5 * dVar3;
  }
  else {
    dVar4 = *(double *)(in_FS_OFFSET + -0x10);
  }
  return dVar4 * sigma + mu;
}

Assistant:

double generateGaussianNoise(double mu, double sigma) {
    static const double epsilon = std::numeric_limits<double>::min();
    static const double two_pi = 2.0 * 3.14159265358979323846;

    thread_local double z1;
    thread_local bool generate;
    generate = !generate;

    if (!generate)
        return z1 * sigma + mu;

    double u1, u2;
    do {
        u1 = rand() * (1.0 / RAND_MAX);
        u2 = rand() * (1.0 / RAND_MAX);
    } while (u1 <= epsilon);

    double z0;
    z0 = sqrt(-2.0 * log(u1)) * cos(two_pi * u2);
    z1 = sqrt(-2.0 * log(u1)) * sin(two_pi * u2);
    return z0 * sigma + mu;
}